

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::readNumericalWords(string *ustring,size_t *index)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  const_iterator pvVar5;
  __tuple_element_t<1UL,_tuple<const_char_*,_double,_int>_> *p_Var6;
  __tuple_element_t<2UL,_tuple<const_char_*,_double,_int>_> *p_Var7;
  pointer pcVar8;
  const_iterator pvVar9;
  pointer pcVar10;
  reference pvVar11;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double dVar12;
  size_t *index_00;
  double toTen;
  value_type *wp_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<std::tuple<const_char_*,_double,_int>,_8UL> *__range1_1;
  double val_p2;
  double val_add;
  size_t index_sub;
  double val_p2_1;
  size_t index_sub_1;
  size_type loc;
  value_type *wp;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::tuple<const_char_*,_double,_int>,_6UL> *__range1;
  string lcstring;
  double val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe58;
  char *__s;
  string *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  size_type sVar13;
  const_iterator local_138;
  double local_e0;
  const_iterator local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7ff4000000000000;
  (in_RSI->_M_dataplus)._M_p = (pointer)0x0;
  sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  if ((2 < sVar4) && (bVar1 = hasValidNumericalWordStart(in_stack_fffffffffffffe60), bVar1)) {
    std::__cxx11::string::string
              (in_stack_fffffffffffffe80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe78);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              (in_stack_fffffffffffffe38);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe48._M_current);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              (in_stack_fffffffffffffe38);
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (_func_int_int *)in_stack_fffffffffffffe40);
    local_80 = std::array<std::tuple<const_char_*,_double,_int>,_6UL>::begin
                         ((array<std::tuple<const_char_*,_double,_int>,_6UL> *)0x780ddc);
    pvVar5 = std::array<std::tuple<const_char_*,_double,_int>,_6UL>::end
                       ((array<std::tuple<const_char_*,_double,_int>,_6UL> *)0x780df0);
    for (; local_80 != pvVar5; local_80 = local_80 + 1) {
      std::get<0ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x780e2b);
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,in_stack_fffffffffffffe58._M_current,
                   (size_type)in_stack_fffffffffffffe50._M_current);
      if (sVar4 != 0xffffffffffffffff) {
        if (sVar4 == 0) {
          p_Var6 = std::get<1ul,char_const*,double,int>
                             ((tuple<const_char_*,_double,_int> *)0x780e7e);
          local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*p_Var6;
          p_Var7 = std::get<2ul,char_const*,double,int>
                             ((tuple<const_char_*,_double,_int> *)0x780e98);
          (in_RSI->_M_dataplus)._M_p = (pointer)(long)*p_Var7;
          pcVar10 = (in_RSI->_M_dataplus)._M_p;
          pcVar8 = (pointer)CLI::std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                      (&local_40);
          if (pcVar10 < pcVar8) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe58._M_current,
                   (size_type)in_stack_fffffffffffffe50._M_current,
                   (size_type)in_stack_fffffffffffffe48._M_current);
            dVar12 = readNumericalWords(in_RSI,(size_t *)local_8);
            std::__cxx11::string::~string(in_stack_fffffffffffffe40);
            uVar2 = std::isnan(dVar12);
            if ((uVar2 & 1) == 0) {
              if (dVar12 < (double)local_8) {
                local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (dVar12 + (double)local_8);
              }
              else {
                local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((double)local_8 * dVar12);
              }
              (in_RSI->_M_dataplus)._M_p = (in_RSI->_M_dataplus)._M_p;
            }
          }
        }
        else {
          p_Var6 = std::get<1ul,char_const*,double,int>
                             ((tuple<const_char_*,_double,_int> *)0x78102a);
          index_00 = (size_t *)*p_Var6;
          sVar13 = sVar4;
          p_Var7 = std::get<2ul,char_const*,double,int>
                             ((tuple<const_char_*,_double,_int> *)0x781051);
          (in_RSI->_M_dataplus)._M_p = (pointer)(sVar13 + (long)*p_Var7);
          local_e0 = 0.0;
          pcVar10 = (in_RSI->_M_dataplus)._M_p;
          pcVar8 = (pointer)CLI::std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                      (&local_40);
          if (pcVar10 < pcVar8) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe58._M_current,
                   (size_type)in_stack_fffffffffffffe50._M_current,
                   (size_type)in_stack_fffffffffffffe48._M_current);
            local_e0 = readNumericalWords(in_RSI,index_00);
            std::__cxx11::string::~string(in_stack_fffffffffffffe40);
            uVar2 = std::isnan(local_e0);
            if ((uVar2 & 1) == 0) {
              if ((double)index_00 <= local_e0) {
                index_00 = (size_t *)((double)index_00 * local_e0);
                local_e0 = 0.0;
              }
              (in_RSI->_M_dataplus)._M_p = (in_RSI->_M_dataplus)._M_p;
            }
            else {
              local_e0 = 0.0;
            }
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe58._M_current,
                 (size_type)in_stack_fffffffffffffe50._M_current,
                 (size_type)in_stack_fffffffffffffe48._M_current);
          local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    readNumericalWords(in_RSI,index_00);
          std::__cxx11::string::~string(in_stack_fffffffffffffe40);
          uVar2 = std::isnan((double)local_8);
          if (((uVar2 & 1) == 0) && (sVar4 == 0)) {
            local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_e0 + (double)local_8 * (double)index_00);
          }
          else {
            (in_RSI->_M_dataplus)._M_p = (pointer)0x0;
          }
        }
        goto LAB_007815ad;
      }
    }
    iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(in_stack_fffffffffffffe70,
                    CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                    (size_type)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58._M_current);
    if (iVar3 == 0) {
      (in_RSI->_M_dataplus)._M_p = (in_RSI->_M_dataplus)._M_p + 3;
    }
    local_138 = std::array<std::tuple<const_char_*,_double,_int>,_8UL>::begin
                          ((array<std::tuple<const_char_*,_double,_int>,_8UL> *)0x781345);
    pvVar9 = std::array<std::tuple<const_char_*,_double,_int>,_8UL>::end
                       ((array<std::tuple<const_char_*,_double,_int>,_8UL> *)0x781359);
    for (; local_138 != pvVar9; local_138 = local_138 + 1) {
      __s = (in_RSI->_M_dataplus)._M_p;
      p_Var7 = std::get<2ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x7813a4);
      sVar4 = (size_type)*p_Var7;
      std::get<0ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x7813b9);
      in_stack_fffffffffffffe68 =
           CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           compare(in_stack_fffffffffffffe70,CONCAT44(iVar3,in_stack_fffffffffffffe68),sVar4,__s);
      if (in_stack_fffffffffffffe68 == 0) {
        p_Var6 = std::get<1ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x7813f3);
        local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*p_Var6;
        p_Var7 = std::get<2ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x78140d);
        (in_RSI->_M_dataplus)._M_p = (in_RSI->_M_dataplus)._M_p + *p_Var7;
        pcVar10 = (pointer)CLI::std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                     (&local_40);
        if ((in_RSI->_M_dataplus)._M_p < pcVar10) {
          pvVar11 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                              (in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
          if (*pvVar11 == '-') {
            (in_RSI->_M_dataplus)._M_p = (in_RSI->_M_dataplus)._M_p + 1;
          }
          dVar12 = read1To10(in_stack_fffffffffffffe78,(size_t *)in_stack_fffffffffffffe70);
          uVar2 = std::isnan(dVar12);
          if ((uVar2 & 1) == 0) {
            local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (dVar12 + (double)local_8);
          }
        }
        goto LAB_007815ad;
      }
    }
    in_stack_fffffffffffffe40 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         readTeens(in_stack_fffffffffffffe78,(size_t *)in_stack_fffffffffffffe70);
    local_8 = in_stack_fffffffffffffe40;
    uVar2 = std::isnan((double)in_stack_fffffffffffffe40);
    if ((uVar2 & 1) != 0) {
      local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                read1To10(in_stack_fffffffffffffe78,(size_t *)in_stack_fffffffffffffe70);
    }
LAB_007815ad:
    std::__cxx11::string::~string(in_stack_fffffffffffffe40);
  }
  return (double)local_8;
}

Assistant:

static double readNumericalWords(const std::string& ustring, size_t& index)
{
    double val = constants::invalid_conversion;
    index = 0;
    if (ustring.size() < 3) {
        return val;
    }
    if (!hasValidNumericalWordStart(ustring)) {
        return val;
    }
    std::string lcstring{ustring};
    // make the string lower case for consistency
    std::transform(
        lcstring.begin(), lcstring.end(), lcstring.begin(), ::tolower);
    for (const auto& wp : groupNumericalWords) {
        auto loc = lcstring.find(std::get<0>(wp));
        if (loc != std::string::npos) {
            if (loc == 0) {
                size_t index_sub{0};
                val = std::get<1>(wp);
                index = std::get<2>(wp);
                if (index < lcstring.size()) {
                    double val_p2 =
                        readNumericalWords(lcstring.substr(index), index_sub);
                    if (!std::isnan(val_p2)) {
                        if (val_p2 >= val) {
                            val = val * val_p2;
                        } else {
                            val += val_p2;
                        }

                        index += index_sub;
                    }
                }
                return val;
            }
            size_t index_sub{0};
            val = std::get<1>(wp);
            index = loc + std::get<2>(wp);
            // read the next component
            double val_add{0.0};
            if (index < lcstring.size()) {
                val_add = readNumericalWords(lcstring.substr(index), index_sub);
                if (!std::isnan(val_add)) {
                    if (val_add >= val) {
                        val = val * val_add;
                        val_add = 0.0;
                    }
                    index += index_sub;
                } else {
                    val_add = 0.0;
                }
            }
            // read the previous part
            double val_p2 =
                readNumericalWords(lcstring.substr(0, loc), index_sub);
            if (std::isnan(val_p2) || index_sub < loc) {
                index = index_sub;
                return val_p2;
            }
            val *= val_p2;
            val += val_add;
            return val;
        }
    }
    // clean up "and"
    if (lcstring.compare(0, 3, "and") == 0) {
        index += 3;
    }
    // what we are left with is values below a hundred
    for (const auto& wp : decadeWords) {
        if (lcstring.compare(index, std::get<2>(wp), std::get<0>(wp)) == 0) {
            val = std::get<1>(wp);
            index += std::get<2>(wp);
            if (lcstring.size() > index) {
                if (lcstring[index] == '-') {
                    ++index;
                }
                double toTen = read1To10(lcstring, index);
                if (!std::isnan(toTen)) {
                    val += toTen;
                }
            }
            return val;
        }
    }
    val = readTeens(lcstring, index);
    if (!std::isnan(val)) {
        return val;
    }
    val = read1To10(lcstring, index);
    return val;
}